

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t ZSTD_compressBegin_internal
                 (ZSTD_CCtx *cctx,void *dict,size_t dictSize,ZSTD_dictContentType_e dictContentType,
                 ZSTD_dictTableLoadMethod_e dtlm,ZSTD_CDict *cdict,ZSTD_CCtx_params *params,
                 U64 pledgedSrcSize,ZSTD_buffered_policy_e zbuff)

{
  ZSTD_compressionParameters *pZVar1;
  ZSTD_dictAttachPref_e ZVar2;
  U32 UVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  ZSTD_strategy ZVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  ZSTD_strategy ZVar17;
  BYTE *pBVar18;
  BYTE *pBVar19;
  ZSTD_compressionParameters cParams;
  ZSTD_compressionParameters cPar;
  ZSTD_CCtx_params params_00;
  ZSTD_CCtx_params params_01;
  ZSTD_CCtx_params params_02;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  U32 UVar26;
  U32 end;
  uint uVar27;
  size_t sVar28;
  ulong uVar29;
  uint uVar30;
  long lVar31;
  ZSTD_matchState_t *srcMatchState;
  undefined8 *puVar32;
  undefined8 *puVar33;
  size_t err_code;
  size_t sVar34;
  byte bVar35;
  undefined8 uVar36;
  undefined8 uVar37;
  undefined4 in_stack_fffffffffffffe74;
  undefined1 auVar38 [12];
  undefined1 auVar39 [24];
  undefined1 in_stack_fffffffffffffe78 [112];
  undefined1 auVar40 [24];
  undefined4 local_fc;
  undefined4 uStack_f8;
  undefined4 local_dc;
  undefined4 uStack_d8;
  undefined1 local_c0 [8];
  undefined4 uStack_b8;
  undefined4 uStack_b4;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  undefined8 uStack_a8;
  
  bVar35 = 0;
  pZVar1 = &params->cParams;
  uVar36._0_4_ = pZVar1->windowLog;
  uVar36._4_4_ = pZVar1->chainLog;
  uVar4 = (params->cParams).hashLog;
  uVar5 = (params->cParams).searchLog;
  uVar20 = pZVar1->windowLog;
  uVar21 = pZVar1->chainLog;
  uVar22 = pZVar1->hashLog;
  cParams.hashLog = uVar22;
  cParams.chainLog = uVar21;
  cParams.windowLog = uVar20;
  uVar6 = (params->cParams).minMatch;
  uVar7 = (params->cParams).targetLength;
  ZVar8 = (params->cParams).strategy;
  cParams.searchLog = uVar5;
  cParams.minMatch = uVar6;
  cParams.targetLength = uVar7;
  cParams.strategy = ZVar8;
  sVar28 = ZSTD_checkCParams(cParams);
  if (0xffffffffffffff88 < sVar28) {
    __assert_fail("!ZSTD_isError(ZSTD_checkCParams(params->cParams))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x3637,
                  "size_t ZSTD_compressBegin_internal(ZSTD_CCtx *, const void *, size_t, ZSTD_dictContentType_e, ZSTD_dictTableLoadMethod_e, const ZSTD_CDict *, const ZSTD_CCtx_params *, U64, ZSTD_buffered_policy_e)"
                 );
  }
  if (cdict != (ZSTD_CDict *)0x0 && dict != (void *)0x0) {
    __assert_fail("!((dict) && (cdict))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x3638,
                  "size_t ZSTD_compressBegin_internal(ZSTD_CCtx *, const void *, size_t, ZSTD_dictContentType_e, ZSTD_dictTableLoadMethod_e, const ZSTD_CDict *, const ZSTD_CCtx_params *, U64, ZSTD_buffered_policy_e)"
                 );
  }
  if ((((cdict == (ZSTD_CDict *)0x0) || (cdict->dictContentSize == 0)) ||
      ((0x1ffff < pledgedSrcSize &&
       (((pledgedSrcSize != 0xffffffffffffffff &&
         (uVar29 = cdict->dictContentSize * 6,
         uVar29 < pledgedSrcSize || uVar29 - pledgedSrcSize == 0)) && (cdict->compressionLevel != 0)
        ))))) || (ZVar2 = params->attachDictPref, ZVar2 == ZSTD_dictForceLoad)) {
    puVar32 = (undefined8 *)&stack0xfffffffffffffe58;
    for (lVar31 = 0x12; lVar31 != 0; lVar31 = lVar31 + -1) {
      *puVar32 = *(undefined8 *)params;
      params = (ZSTD_CCtx_params *)((long)params + (ulong)bVar35 * -0x10 + 8);
      puVar32 = puVar32 + (ulong)bVar35 * -2 + 1;
    }
    params_00.cParams.chainLog = uVar4;
    params_00.format = (int)uVar36;
    params_00.cParams.windowLog = (int)((ulong)uVar36 >> 0x20);
    params_00.cParams.hashLog = uVar5;
    params_00.cParams.searchLog = uVar6;
    params_00.cParams.minMatch = uVar7;
    params_00.cParams.targetLength = ZVar8;
    params_00.cParams.strategy = in_stack_fffffffffffffe74;
    auVar38 = in_stack_fffffffffffffe78._0_12_;
    auVar39 = in_stack_fffffffffffffe78._64_24_;
    auVar40 = in_stack_fffffffffffffe78._88_24_;
    params_00.fParams.contentSizeFlag = auVar38._0_4_;
    params_00.fParams.checksumFlag = auVar38._4_4_;
    params_00.fParams.noDictIDFlag = auVar38._8_4_;
    params_00.compressionLevel = in_stack_fffffffffffffe78._12_4_;
    params_00.forceWindow = in_stack_fffffffffffffe78._16_4_;
    params_00._52_4_ = in_stack_fffffffffffffe78._20_4_;
    params_00.targetCBlockSize = in_stack_fffffffffffffe78._24_8_;
    params_00.srcSizeHint = in_stack_fffffffffffffe78._32_4_;
    params_00.attachDictPref = in_stack_fffffffffffffe78._36_4_;
    params_00.literalCompressionMode = in_stack_fffffffffffffe78._40_4_;
    params_00.nbWorkers = in_stack_fffffffffffffe78._44_4_;
    params_00.jobSize = in_stack_fffffffffffffe78._48_8_;
    params_00.overlapLog = in_stack_fffffffffffffe78._56_4_;
    params_00.rsyncable = in_stack_fffffffffffffe78._60_4_;
    params_00.ldmParams.enableLdm = auVar39._0_4_;
    params_00.ldmParams.hashLog = auVar39._4_4_;
    params_00.ldmParams.bucketSizeLog = auVar39._8_4_;
    params_00.ldmParams.minMatchLength = auVar39._12_4_;
    params_00.ldmParams.hashRateLog = auVar39._16_4_;
    params_00.ldmParams.windowLog = auVar39._20_4_;
    params_00.customMem.customAlloc = (ZSTD_allocFunction)auVar40._0_8_;
    params_00.customMem.customFree = (ZSTD_freeFunction)auVar40._8_8_;
    params_00.customMem.opaque = (void *)auVar40._16_8_;
    sVar28 = ZSTD_resetCCtx_internal(cctx,params_00,pledgedSrcSize,ZSTDcrp_makeClean,zbuff);
    if (0xffffffffffffff88 < sVar28) {
      return sVar28;
    }
    if (cdict == (ZSTD_CDict *)0x0) {
      uVar4 = SUB84(cctx->entropyWorkspace,0);
      uVar5 = (undefined4)((ulong)cctx->entropyWorkspace >> 0x20);
    }
    else {
      dict = cdict->dictContent;
      dictSize = cdict->dictContentSize;
      uVar4 = SUB84(cctx->entropyWorkspace,0);
      uVar5 = (undefined4)((ulong)cctx->entropyWorkspace >> 0x20);
    }
    sVar28 = ZSTD_compress_insertDictionary
                       ((cctx->blockState).prevCBlock,&(cctx->blockState).matchState,&cctx->ldmState
                        ,&cctx->workspace,&cctx->appliedParams,dict,dictSize,dictContentType,dtlm,
                        (void *)CONCAT44(uVar5,uVar4));
    if (0xffffffffffffff88 < sVar28) {
      return sVar28;
    }
    if (sVar28 >> 0x20 != 0) {
      __assert_fail("dictID <= UINT_MAX",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x3650,
                    "size_t ZSTD_compressBegin_internal(ZSTD_CCtx *, const void *, size_t, ZSTD_dictContentType_e, ZSTD_dictTableLoadMethod_e, const ZSTD_CDict *, const ZSTD_CCtx_params *, U64, ZSTD_buffered_policy_e)"
                   );
    }
    cctx->dictID = (U32)sVar28;
LAB_001404d3:
    sVar28 = 0;
  }
  else {
    if ((pledgedSrcSize == 0xffffffffffffffff) ||
       (pledgedSrcSize <= attachDictSizeCutoffs[(cdict->matchState).cParams.strategy])) {
      if (ZVar2 != ZSTD_dictForceCopy) goto LAB_001404e6;
    }
    else if (ZVar2 == ZSTD_dictForceAttach) {
LAB_001404e6:
      if (params->forceWindow == 0) {
        memcpy(local_c0,params,0x90);
        uVar4 = local_c0._4_4_;
        if (local_c0._4_4_ == 0) {
          __assert_fail("windowLog != 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x3099,
                        "size_t ZSTD_resetCCtx_byAttachingCDict(ZSTD_CCtx *, const ZSTD_CDict *, ZSTD_CCtx_params, U64, ZSTD_buffered_policy_e)"
                       );
        }
        pZVar1 = &(cdict->matchState).cParams;
        uVar37._0_4_ = pZVar1->windowLog;
        uVar37._4_4_ = pZVar1->chainLog;
        uVar13 = (cdict->matchState).cParams.hashLog;
        uVar14 = (cdict->matchState).cParams.searchLog;
        uVar23 = pZVar1->windowLog;
        uVar24 = pZVar1->chainLog;
        uVar25 = pZVar1->hashLog;
        cPar.hashLog = uVar25;
        cPar.chainLog = uVar24;
        cPar.windowLog = uVar23;
        uVar15 = (cdict->matchState).cParams.minMatch;
        uVar16 = (cdict->matchState).cParams.targetLength;
        ZVar17 = (cdict->matchState).cParams.strategy;
        cPar.searchLog = uVar14;
        cPar.minMatch = uVar15;
        cPar.targetLength = uVar16;
        cPar.strategy = ZVar17;
        ZSTD_adjustCParams_internal
                  ((ZSTD_compressionParameters *)(local_c0 + 4),cPar,pledgedSrcSize,0);
        stack0xffffffffffffff44 = CONCAT44(uStack_b8,uVar4);
        puVar32 = (undefined8 *)local_c0;
        puVar33 = (undefined8 *)&stack0xfffffffffffffe58;
        for (lVar31 = 0x12; lVar31 != 0; lVar31 = lVar31 + -1) {
          *puVar33 = *puVar32;
          puVar32 = puVar32 + (ulong)bVar35 * -2 + 1;
          puVar33 = puVar33 + (ulong)bVar35 * -2 + 1;
        }
        params_02.cParams.chainLog = uVar13;
        params_02.format = (int)uVar37;
        params_02.cParams.windowLog = (int)((ulong)uVar37 >> 0x20);
        params_02.cParams.hashLog = uVar14;
        params_02.cParams.searchLog = uVar15;
        params_02.cParams.minMatch = uVar16;
        params_02.cParams.targetLength = ZVar17;
        params_02.cParams.strategy = in_stack_fffffffffffffe74;
        auVar38 = in_stack_fffffffffffffe78._0_12_;
        auVar39 = in_stack_fffffffffffffe78._64_24_;
        auVar40 = in_stack_fffffffffffffe78._88_24_;
        params_02.fParams.contentSizeFlag = auVar38._0_4_;
        params_02.fParams.checksumFlag = auVar38._4_4_;
        params_02.fParams.noDictIDFlag = auVar38._8_4_;
        params_02.compressionLevel = in_stack_fffffffffffffe78._12_4_;
        params_02.forceWindow = in_stack_fffffffffffffe78._16_4_;
        params_02._52_4_ = in_stack_fffffffffffffe78._20_4_;
        params_02.targetCBlockSize = in_stack_fffffffffffffe78._24_8_;
        params_02.srcSizeHint = in_stack_fffffffffffffe78._32_4_;
        params_02.attachDictPref = in_stack_fffffffffffffe78._36_4_;
        params_02.literalCompressionMode = in_stack_fffffffffffffe78._40_4_;
        params_02.nbWorkers = in_stack_fffffffffffffe78._44_4_;
        params_02.jobSize = in_stack_fffffffffffffe78._48_8_;
        params_02.overlapLog = in_stack_fffffffffffffe78._56_4_;
        params_02.rsyncable = in_stack_fffffffffffffe78._60_4_;
        params_02.ldmParams.enableLdm = auVar39._0_4_;
        params_02.ldmParams.hashLog = auVar39._4_4_;
        params_02.ldmParams.bucketSizeLog = auVar39._8_4_;
        params_02.ldmParams.minMatchLength = auVar39._12_4_;
        params_02.ldmParams.hashRateLog = auVar39._16_4_;
        params_02.ldmParams.windowLog = auVar39._20_4_;
        params_02.customMem.customAlloc = (ZSTD_allocFunction)auVar40._0_8_;
        params_02.customMem.customFree = (ZSTD_freeFunction)auVar40._8_8_;
        params_02.customMem.opaque = (void *)auVar40._16_8_;
        sVar28 = ZSTD_resetCCtx_internal(cctx,params_02,pledgedSrcSize,ZSTDcrp_makeClean,zbuff);
        if (0xffffffffffffff88 < sVar28) {
          return sVar28;
        }
        if ((cctx->appliedParams).cParams.strategy != (cdict->matchState).cParams.strategy) {
          __assert_fail("cctx->appliedParams.cParams.strategy == cdict_cParams->strategy",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x30a1,
                        "size_t ZSTD_resetCCtx_byAttachingCDict(ZSTD_CCtx *, const ZSTD_CDict *, ZSTD_CCtx_params, U64, ZSTD_buffered_policy_e)"
                       );
        }
        uVar29 = (long)(cdict->matchState).window.nextSrc - (long)(cdict->matchState).window.base;
        uVar27 = (uint)uVar29;
        if ((cdict->matchState).window.dictLimit != uVar27) {
          (cctx->blockState).matchState.dictMatchState = &cdict->matchState;
          uVar30 = (cctx->blockState).matchState.window.dictLimit;
          if (uVar30 < uVar27) {
            (cctx->blockState).matchState.window.nextSrc =
                 (cctx->blockState).matchState.window.base + (uVar29 & 0xffffffff);
            (cctx->blockState).matchState.window.lowLimit = uVar27;
            (cctx->blockState).matchState.window.dictLimit = uVar27;
            uVar30 = uVar27;
          }
          (cctx->blockState).matchState.loadedDictEnd = uVar30;
        }
        cctx->dictID = cdict->dictID;
        memcpy((cctx->blockState).prevCBlock,&cdict->cBlockState,0x11f0);
        goto LAB_001404d3;
      }
    }
    memcpy(local_c0,params,0x90);
    if (local_c0._4_4_ == 0) {
      __assert_fail("windowLog != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x30cc,
                    "size_t ZSTD_resetCCtx_byCopyingCDict(ZSTD_CCtx *, const ZSTD_CDict *, ZSTD_CCtx_params, U64, ZSTD_buffered_policy_e)"
                   );
    }
    uVar9 = (cdict->matchState).cParams.chainLog;
    uVar10 = (cdict->matchState).cParams.hashLog;
    uVar11 = (cdict->matchState).cParams.searchLog;
    uVar12 = (cdict->matchState).cParams.minMatch;
    uStack_ac = uVar12;
    uStack_a8._0_4_ = (cdict->matchState).cParams.targetLength;
    uStack_a8._4_4_ = (cdict->matchState).cParams.strategy;
    uStack_b4 = uVar10;
    uStack_b0 = uVar11;
    stack0xffffffffffffff44 = CONCAT44(uVar9,local_c0._4_4_);
    puVar32 = (undefined8 *)local_c0;
    puVar33 = (undefined8 *)&stack0xfffffffffffffe58;
    for (lVar31 = 0x12; lVar31 != 0; lVar31 = lVar31 + -1) {
      *puVar33 = *puVar32;
      puVar32 = puVar32 + (ulong)bVar35 * -2 + 1;
      puVar33 = puVar33 + (ulong)bVar35 * -2 + 1;
    }
    params_01.cParams.chainLog = uVar4;
    params_01.format = (int)uVar36;
    params_01.cParams.windowLog = (int)((ulong)uVar36 >> 0x20);
    params_01.cParams.hashLog = uVar5;
    params_01.cParams.searchLog = uVar6;
    params_01.cParams.minMatch = uVar7;
    params_01.cParams.targetLength = ZVar8;
    params_01.cParams.strategy = in_stack_fffffffffffffe74;
    auVar38 = in_stack_fffffffffffffe78._0_12_;
    auVar39 = in_stack_fffffffffffffe78._64_24_;
    auVar40 = in_stack_fffffffffffffe78._88_24_;
    params_01.fParams.contentSizeFlag = auVar38._0_4_;
    params_01.fParams.checksumFlag = auVar38._4_4_;
    params_01.fParams.noDictIDFlag = auVar38._8_4_;
    params_01.compressionLevel = in_stack_fffffffffffffe78._12_4_;
    params_01.forceWindow = in_stack_fffffffffffffe78._16_4_;
    params_01._52_4_ = in_stack_fffffffffffffe78._20_4_;
    params_01.targetCBlockSize = in_stack_fffffffffffffe78._24_8_;
    params_01.srcSizeHint = in_stack_fffffffffffffe78._32_4_;
    params_01.attachDictPref = in_stack_fffffffffffffe78._36_4_;
    params_01.literalCompressionMode = in_stack_fffffffffffffe78._40_4_;
    params_01.nbWorkers = in_stack_fffffffffffffe78._44_4_;
    params_01.jobSize = in_stack_fffffffffffffe78._48_8_;
    params_01.overlapLog = in_stack_fffffffffffffe78._56_4_;
    params_01.rsyncable = in_stack_fffffffffffffe78._60_4_;
    params_01.ldmParams.enableLdm = auVar39._0_4_;
    params_01.ldmParams.hashLog = auVar39._4_4_;
    params_01.ldmParams.bucketSizeLog = auVar39._8_4_;
    params_01.ldmParams.minMatchLength = auVar39._12_4_;
    params_01.ldmParams.hashRateLog = auVar39._16_4_;
    params_01.ldmParams.windowLog = auVar39._20_4_;
    params_01.customMem.customAlloc = (ZSTD_allocFunction)auVar40._0_8_;
    params_01.customMem.customFree = (ZSTD_freeFunction)auVar40._8_8_;
    params_01.customMem.opaque = (void *)auVar40._16_8_;
    sVar28 = ZSTD_resetCCtx_internal(cctx,params_01,pledgedSrcSize,ZSTDcrp_leaveDirty,zbuff);
    if (sVar28 < 0xffffffffffffff89) {
      if ((cctx->appliedParams).cParams.strategy != (cdict->matchState).cParams.strategy) {
        __assert_fail("cctx->appliedParams.cParams.strategy == cdict_cParams->strategy",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x30d2,
                      "size_t ZSTD_resetCCtx_byCopyingCDict(ZSTD_CCtx *, const ZSTD_CDict *, ZSTD_CCtx_params, U64, ZSTD_buffered_policy_e)"
                     );
      }
      if ((cctx->appliedParams).cParams.hashLog != (cdict->matchState).cParams.hashLog) {
        __assert_fail("cctx->appliedParams.cParams.hashLog == cdict_cParams->hashLog",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x30d3,
                      "size_t ZSTD_resetCCtx_byCopyingCDict(ZSTD_CCtx *, const ZSTD_CDict *, ZSTD_CCtx_params, U64, ZSTD_buffered_policy_e)"
                     );
      }
      if ((cctx->appliedParams).cParams.chainLog != (cdict->matchState).cParams.chainLog) {
        __assert_fail("cctx->appliedParams.cParams.chainLog == cdict_cParams->chainLog",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x30d4,
                      "size_t ZSTD_resetCCtx_byCopyingCDict(ZSTD_CCtx *, const ZSTD_CDict *, ZSTD_CCtx_params, U64, ZSTD_buffered_policy_e)"
                     );
      }
      ZSTD_cwksp_mark_tables_dirty(&cctx->workspace);
      if ((cdict->matchState).cParams.strategy == ZSTD_fast) {
        sVar34 = 0;
      }
      else {
        sVar34 = 4L << ((byte)(cdict->matchState).cParams.chainLog & 0x3f);
      }
      memcpy((cctx->blockState).matchState.hashTable,(cdict->matchState).hashTable,
             4L << ((byte)(cdict->matchState).cParams.hashLog & 0x3f));
      memcpy((cctx->blockState).matchState.chainTable,(cdict->matchState).chainTable,sVar34);
      if ((cdict->matchState).hashLog3 != 0) {
        __assert_fail("cdict->matchState.hashLog3 == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x30e8,
                      "size_t ZSTD_resetCCtx_byCopyingCDict(ZSTD_CCtx *, const ZSTD_CDict *, ZSTD_CCtx_params, U64, ZSTD_buffered_policy_e)"
                     );
      }
      UVar3 = (cctx->blockState).matchState.hashLog3;
      sVar28 = 0;
      sVar34 = 4L << ((byte)UVar3 & 0x3f);
      if (UVar3 == 0) {
        sVar34 = sVar28;
      }
      memset((cctx->blockState).matchState.hashTable3,0,sVar34);
      ZSTD_cwksp_mark_tables_clean(&cctx->workspace);
      pBVar18 = (cdict->matchState).window.base;
      pBVar19 = (cdict->matchState).window.dictBase;
      UVar3 = (cdict->matchState).window.dictLimit;
      UVar26 = (cdict->matchState).window.lowLimit;
      (cctx->blockState).matchState.window.nextSrc = (cdict->matchState).window.nextSrc;
      (cctx->blockState).matchState.window.base = pBVar18;
      (cctx->blockState).matchState.window.dictBase = pBVar19;
      (cctx->blockState).matchState.window.dictLimit = UVar3;
      (cctx->blockState).matchState.window.lowLimit = UVar26;
      UVar3 = (cdict->matchState).nextToUpdate;
      (cctx->blockState).matchState.loadedDictEnd = (cdict->matchState).loadedDictEnd;
      (cctx->blockState).matchState.nextToUpdate = UVar3;
      cctx->dictID = cdict->dictID;
      memcpy((cctx->blockState).prevCBlock,&cdict->cBlockState,0x11f0);
    }
  }
  return sVar28;
}

Assistant:

static size_t ZSTD_compressBegin_internal(ZSTD_CCtx* cctx,
                                    const void* dict, size_t dictSize,
                                    ZSTD_dictContentType_e dictContentType,
                                    ZSTD_dictTableLoadMethod_e dtlm,
                                    const ZSTD_CDict* cdict,
                                    const ZSTD_CCtx_params* params, U64 pledgedSrcSize,
                                    ZSTD_buffered_policy_e zbuff)
{
    DEBUGLOG(4, "ZSTD_compressBegin_internal: wlog=%u", params->cParams.windowLog);
    /* params are supposed to be fully validated at this point */
    assert(!ZSTD_isError(ZSTD_checkCParams(params->cParams)));
    assert(!((dict) && (cdict)));  /* either dict or cdict, not both */
    if ( (cdict)
      && (cdict->dictContentSize > 0)
      && ( pledgedSrcSize < ZSTD_USE_CDICT_PARAMS_SRCSIZE_CUTOFF
        || pledgedSrcSize < cdict->dictContentSize * ZSTD_USE_CDICT_PARAMS_DICTSIZE_MULTIPLIER
        || pledgedSrcSize == ZSTD_CONTENTSIZE_UNKNOWN
        || cdict->compressionLevel == 0)
      && (params->attachDictPref != ZSTD_dictForceLoad) ) {
        return ZSTD_resetCCtx_usingCDict(cctx, cdict, params, pledgedSrcSize, zbuff);
    }

    FORWARD_IF_ERROR( ZSTD_resetCCtx_internal(cctx, *params, pledgedSrcSize,
                                     ZSTDcrp_makeClean, zbuff) );
    {   size_t const dictID = cdict ?
                ZSTD_compress_insertDictionary(
                        cctx->blockState.prevCBlock, &cctx->blockState.matchState,
                        &cctx->ldmState, &cctx->workspace, &cctx->appliedParams, cdict->dictContent,
                        cdict->dictContentSize, dictContentType, dtlm,
                        cctx->entropyWorkspace)
              : ZSTD_compress_insertDictionary(
                        cctx->blockState.prevCBlock, &cctx->blockState.matchState,
                        &cctx->ldmState, &cctx->workspace, &cctx->appliedParams, dict, dictSize,
                        dictContentType, dtlm, cctx->entropyWorkspace);
        FORWARD_IF_ERROR(dictID);
        assert(dictID <= UINT_MAX);
        cctx->dictID = (U32)dictID;
    }
    return 0;
}